

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O2

void unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
               (rt_binary_expr<viennamath::rt_expression_interface<double>_> *e)

{
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_00;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_01;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_02;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_03;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_04;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_05;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_06;
  double __x;
  double dVar1;
  double __x_00;
  double __x_01;
  double __x_02;
  double extraout_XMM0_Qa;
  double __x_03;
  double __x_04;
  double __x_05;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_140;
  vector<double,_std::allocator<double>_> p;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_110;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_f0;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_d0;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_b0;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_90;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_70;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_50;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_30;
  
  std::vector<double,_std::allocator<double>_>::vector(&p,3,(allocator_type *)&local_140);
  *p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       4.0;
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 6.0;
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[2]
       = 8.0;
  viennamath::exp<viennamath::rt_expression_interface<double>>(&local_140,(viennamath *)e,other);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_30,e);
  (*local_30.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])(&local_30,&p);
  dVar1 = exp(__x);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_140,dVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_30);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_140);
  viennamath::sin<viennamath::rt_expression_interface<double>>(&local_140,(viennamath *)e,other_00);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_50,e);
  (*local_50.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])(&local_50,&p);
  dVar1 = sin(__x_00);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_140,dVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_50);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_140);
  viennamath::cos<viennamath::rt_expression_interface<double>>(&local_140,(viennamath *)e,other_01);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_70,e);
  (*local_70.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])(&local_70,&p);
  dVar1 = cos(__x_01);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_140,dVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_70);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_140);
  viennamath::tan<viennamath::rt_expression_interface<double>>(&local_140,(viennamath *)e,other_02);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_90,e);
  (*local_90.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])(&local_90,&p);
  dVar1 = tan(__x_02);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_140,dVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_90);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_140);
  viennamath::fabs<viennamath::rt_expression_interface<double>>(&local_140,(viennamath *)e,other_03)
  ;
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_b0,e);
  (*local_b0.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])(&local_b0,&p);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_140,ABS(extraout_XMM0_Qa));
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_b0);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_140);
  viennamath::sqrt<viennamath::rt_expression_interface<double>>(&local_140,(viennamath *)e,other_04)
  ;
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_d0,e);
  (*local_d0.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])(&local_d0,&p);
  if (__x_03 < 0.0) {
    dVar1 = sqrt(__x_03);
  }
  else {
    dVar1 = SQRT(__x_03);
  }
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_140,dVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_d0);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_140);
  viennamath::log<viennamath::rt_expression_interface<double>>(&local_140,(viennamath *)e,other_05);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_f0,e);
  (*local_f0.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])(&local_f0,&p);
  dVar1 = log(__x_04);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_140,dVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f0);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_140);
  viennamath::log10<viennamath::rt_expression_interface<double>>
            (&local_140,(viennamath *)e,other_06);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_110,e);
  (*local_110.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])(&local_110,&p)
  ;
  dVar1 = log10(__x_05);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_140,dVar1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_110);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_140);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&p.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void unary_test(E const & e)
{
  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;

  unary_test(viennamath::exp(e),   exp(viennamath::eval(e,p)) );
  unary_test(viennamath::sin(e),   sin(viennamath::eval(e,p)) );
  unary_test(viennamath::cos(e),   cos(viennamath::eval(e,p)) );
  unary_test(viennamath::tan(e),   tan(viennamath::eval(e,p)) );
  unary_test(viennamath::fabs(e),  fabs(viennamath::eval(e,p)) );
  unary_test(viennamath::sqrt(e),  sqrt(viennamath::eval(e,p)) );
  unary_test(viennamath::log(e),   log(viennamath::eval(e,p)) );
  unary_test(viennamath::log10(e), log10(viennamath::eval(e,p)) );
}